

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_realloc_array(JSContext *ctx,void **parray,int elem_size,int *psize,int req_size)

{
  ulong in_RAX;
  void *pvVar1;
  int iVar2;
  int iVar3;
  size_t slack;
  ulong local_28;
  
  iVar3 = (*psize * 3) / 2;
  if (iVar3 < req_size) {
    iVar3 = req_size;
  }
  local_28 = in_RAX;
  pvVar1 = js_realloc2(ctx,*parray,(long)(iVar3 * elem_size),&local_28);
  if (pvVar1 == (void *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = 0;
    *psize = iVar3 + (int)(local_28 / (uint)elem_size);
    *parray = pvVar1;
  }
  return iVar2;
}

Assistant:

static no_inline int js_realloc_array(JSContext *ctx, void **parray,
                                      int elem_size, int *psize, int req_size)
{
    int new_size;
    size_t slack;
    void *new_array;
    /* XXX: potential arithmetic overflow */
    new_size = max_int(req_size, *psize * 3 / 2);
    new_array = js_realloc2(ctx, *parray, new_size * elem_size, &slack);
    if (!new_array)
        return -1;
    new_size += slack / elem_size;
    *psize = new_size;
    *parray = new_array;
    return 0;
}